

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::pair<int,_int>_>_>_>
::destroy_slots(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::pair<int,_int>_>_>_>
                *this)

{
  bool bVar1;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::pair<int,_int>_>_>_>
  *this_local;
  
  bVar1 = is_soo(this);
  if (bVar1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe46,
                  "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<char, std::pair<int, int>>, absl::hash_internal::Hash<char>, std::equal_to<char>, std::allocator<std::pair<const char, std::pair<int, int>>>>::destroy_slots() [Policy = absl::container_internal::FlatHashMapPolicy<char, std::pair<int, int>>, Hash = absl::hash_internal::Hash<char>, Eq = std::equal_to<char>, Alloc = std::allocator<std::pair<const char, std::pair<int, int>>>]"
                 );
  }
  return;
}

Assistant:

inline void destroy_slots() {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    if (PolicyTraits::template destroy_is_trivial<Alloc>()) return;
    IterateOverFullSlots(
        common(), slot_array(),
        [&](const ctrl_t*, slot_type* slot)
            ABSL_ATTRIBUTE_ALWAYS_INLINE { this->destroy(slot); });
  }